

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O0

int nga_test_internal(Integer *nbhandle)

{
  struct_armcihdl_t *psVar1;
  uint uVar2;
  int iVar3;
  uint *in_RDI;
  ga_armcihdl_t *tmp;
  int ret;
  ga_armcihdl_t *next;
  int tag;
  int retval;
  int index;
  gai_nbhdl_t *inbhandle;
  ga_armcihdl_t *local_28;
  uint local_18;
  
  uVar2 = *in_RDI & 0xff;
  local_18 = 0;
  if (*in_RDI >> 8 == ga_ihdl_array[(int)uVar2].ga_nbtag) {
    psVar1 = ga_ihdl_array[(int)uVar2].ahandle;
    while (local_28 = psVar1, local_28 != (ga_armcihdl_t *)0x0) {
      iVar3 = ARMCI_Test((armci_hdl_t *)0x25144a);
      psVar1 = local_28->next;
      if (iVar3 == 0) {
        if (local_28->previous == (struct_armcihdl_t *)0x0) {
          ga_ihdl_array[(int)uVar2].ahandle = local_28->next;
          if (local_28->next != (struct_armcihdl_t *)0x0) {
            local_28->next->previous = (struct_armcihdl_t *)0x0;
          }
        }
        else {
          local_28->previous->next = local_28->next;
          if (local_28->next != (struct_armcihdl_t *)0x0) {
            local_28->next->previous = local_28->previous;
          }
        }
        local_28->previous = (struct_armcihdl_t *)0x0;
        local_28->next = (struct_armcihdl_t *)0x0;
        local_28->active = 0;
        ga_ihdl_array[(int)uVar2].count = ga_ihdl_array[(int)uVar2].count + -1;
      }
    }
    if (ga_ihdl_array[(int)uVar2].count == 0) {
      ga_ihdl_array[(int)uVar2].ahandle = (ga_armcihdl_t *)0x0;
      ga_ihdl_array[(int)uVar2].active = 0;
    }
    local_18 = (uint)(0 < ga_ihdl_array[(int)uVar2].count);
  }
  return local_18;
}

Assistant:

int nga_test_internal(Integer *nbhandle)
{
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  int index = inbhandle->ihdl_index;
  int retval = 0;
  int tag = inbhandle->ga_nbtag;

  /* check if tags match. If they don't then this request was already completed
   * so the handle can be used for another GA non-blocking call. Just return in
   * this case */
  if (tag == ga_ihdl_array[index].ga_nbtag) {
    ga_armcihdl_t* next = ga_ihdl_array[index].ahandle;
    /* Loop over linked list and test all remaining armci non-blocking calls */
    while(next) {
      int ret = ARMCI_Test(&next->handle);
      ga_armcihdl_t *tmp = next->next;
      if (ret == 0) {
        /* operation is completed so remove it from linked list */
        if (next->previous != NULL) {
          /* operation is not first element in list */
          next->previous->next = next->next;
          if (next->next != NULL) {
            next->next->previous = next->previous;
          }
        } else {
          /* operation is first element in list */
          ga_ihdl_array[index].ahandle = next->next;
          if (next->next != NULL) {
            next->next->previous = NULL;
          }
        }
        next->previous = NULL;
        next->next = NULL;
        next->active = 0;
        ga_ihdl_array[index].count--;
      }
      next = tmp;
    }
    if (ga_ihdl_array[index].count == 0) {
      ga_ihdl_array[index].ahandle = NULL;
      ga_ihdl_array[index].active = 0;
    }
    if (ga_ihdl_array[index].count > 0) retval = 1;
  }

  return(retval);
}